

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

int mbedtls_x509_crl_info(char *buf,size_t size,char *prefix,mbedtls_x509_crl *crl)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  mbedtls_x509_crl_entry *local_58;
  mbedtls_x509_crl_entry *entry;
  char *p;
  size_t n;
  int ret;
  mbedtls_x509_crl *crl_local;
  char *prefix_local;
  size_t size_local;
  char *buf_local;
  
  iVar1 = snprintf(buf,size,"%sCRL version   : %d",prefix,(ulong)(uint)crl->version);
  if ((-1 < iVar1) && ((ulong)(long)iVar1 < size)) {
    uVar3 = size - (long)iVar1;
    pcVar4 = buf + iVar1;
    iVar1 = snprintf(pcVar4,uVar3,"\n%sissuer name   : ",prefix);
    if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
      uVar3 = uVar3 - (long)iVar1;
      pcVar4 = pcVar4 + iVar1;
      iVar1 = mbedtls_x509_dn_gets(pcVar4,uVar3,&crl->issuer);
      if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
        uVar3 = uVar3 - (long)iVar1;
        pcVar4 = pcVar4 + iVar1;
        iVar1 = snprintf(pcVar4,uVar3,"\n%sthis update   : %04d-%02d-%02d %02d:%02d:%02d",prefix,
                         (ulong)(uint)(crl->this_update).year,(ulong)(uint)(crl->this_update).mon,
                         (crl->this_update).day,(crl->this_update).hour,(crl->this_update).min,
                         (crl->this_update).sec);
        if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
          uVar3 = uVar3 - (long)iVar1;
          pcVar4 = pcVar4 + iVar1;
          iVar1 = snprintf(pcVar4,uVar3,"\n%snext update   : %04d-%02d-%02d %02d:%02d:%02d",prefix,
                           (ulong)(uint)(crl->next_update).year,(ulong)(uint)(crl->next_update).mon,
                           (crl->next_update).day,(crl->next_update).hour,(crl->next_update).min,
                           (crl->next_update).sec);
          if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
            uVar3 = uVar3 - (long)iVar1;
            local_58 = &crl->entry;
            iVar2 = snprintf(pcVar4 + iVar1,uVar3,"\n%sRevoked certificates:",prefix);
            if ((-1 < iVar2) && ((ulong)(long)iVar2 < uVar3)) {
              p = (char *)(uVar3 - (long)iVar2);
              entry = (mbedtls_x509_crl_entry *)(pcVar4 + iVar1 + iVar2);
              while( true ) {
                bVar5 = false;
                if (local_58 != (mbedtls_x509_crl_entry *)0x0) {
                  bVar5 = (local_58->raw).len != 0;
                }
                if (!bVar5) {
                  iVar1 = snprintf((char *)entry,(size_t)p,"\n%ssigned using  : ",prefix);
                  if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
                    return -0x2980;
                  }
                  uVar3 = (long)p - (long)iVar1;
                  pcVar4 = (char *)((long)&(entry->raw).tag + (long)iVar1);
                  iVar1 = mbedtls_x509_sig_alg_gets
                                    (pcVar4,uVar3,&crl->sig_oid,crl->sig_pk,crl->sig_md,
                                     crl->sig_opts);
                  if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
                    uVar3 = uVar3 - (long)iVar1;
                    iVar1 = snprintf(pcVar4 + iVar1,uVar3,anon_var_dwarf_99d6 + 8);
                    if ((-1 < iVar1) && ((ulong)(long)iVar1 < uVar3)) {
                      return (int)size - ((int)uVar3 - iVar1);
                    }
                    return -0x2980;
                  }
                  return -0x2980;
                }
                iVar1 = snprintf((char *)entry,(size_t)p,"\n%sserial number: ",prefix);
                if ((iVar1 < 0) || (p <= (char *)(long)iVar1)) {
                  return -0x2980;
                }
                uVar3 = (long)p - (long)iVar1;
                pcVar4 = (char *)((long)&(entry->raw).tag + (long)iVar1);
                iVar1 = mbedtls_x509_serial_gets(pcVar4,uVar3,&local_58->serial);
                if ((iVar1 < 0) || (uVar3 <= (ulong)(long)iVar1)) {
                  return -0x2980;
                }
                uVar3 = uVar3 - (long)iVar1;
                pcVar4 = pcVar4 + iVar1;
                iVar1 = snprintf(pcVar4,uVar3," revocation date: %04d-%02d-%02d %02d:%02d:%02d",
                                 (ulong)(uint)(local_58->revocation_date).year,
                                 (ulong)(uint)(local_58->revocation_date).mon,
                                 (ulong)(uint)(local_58->revocation_date).day,
                                 (local_58->revocation_date).hour,(local_58->revocation_date).min,
                                 (local_58->revocation_date).sec);
                if ((iVar1 < 0) || (uVar3 <= (ulong)(long)iVar1)) break;
                p = (char *)(uVar3 - (long)iVar1);
                entry = (mbedtls_x509_crl_entry *)(pcVar4 + iVar1);
                local_58 = local_58->next;
              }
            }
          }
        }
      }
    }
  }
  return -0x2980;
}

Assistant:

int mbedtls_x509_crl_info( char *buf, size_t size, const char *prefix,
                   const mbedtls_x509_crl *crl )
{
    int ret;
    size_t n;
    char *p;
    const mbedtls_x509_crl_entry *entry;

    p = buf;
    n = size;

    ret = mbedtls_snprintf( p, n, "%sCRL version   : %d",
                               prefix, crl->version );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sissuer name   : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;
    ret = mbedtls_x509_dn_gets( p, n, &crl->issuer );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%sthis update   : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crl->this_update.year, crl->this_update.mon,
                   crl->this_update.day,  crl->this_update.hour,
                   crl->this_update.min,  crl->this_update.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n%snext update   : " \
                   "%04d-%02d-%02d %02d:%02d:%02d", prefix,
                   crl->next_update.year, crl->next_update.mon,
                   crl->next_update.day,  crl->next_update.hour,
                   crl->next_update.min,  crl->next_update.sec );
    MBEDTLS_X509_SAFE_SNPRINTF;

    entry = &crl->entry;

    ret = mbedtls_snprintf( p, n, "\n%sRevoked certificates:",
                               prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    while( entry != NULL && entry->raw.len != 0 )
    {
        ret = mbedtls_snprintf( p, n, "\n%sserial number: ",
                               prefix );
        MBEDTLS_X509_SAFE_SNPRINTF;

        ret = mbedtls_x509_serial_gets( p, n, &entry->serial );
        MBEDTLS_X509_SAFE_SNPRINTF;

        ret = mbedtls_snprintf( p, n, " revocation date: " \
                   "%04d-%02d-%02d %02d:%02d:%02d",
                   entry->revocation_date.year, entry->revocation_date.mon,
                   entry->revocation_date.day,  entry->revocation_date.hour,
                   entry->revocation_date.min,  entry->revocation_date.sec );
        MBEDTLS_X509_SAFE_SNPRINTF;

        entry = entry->next;
    }

    ret = mbedtls_snprintf( p, n, "\n%ssigned using  : ", prefix );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_x509_sig_alg_gets( p, n, &crl->sig_oid, crl->sig_pk, crl->sig_md,
                             crl->sig_opts );
    MBEDTLS_X509_SAFE_SNPRINTF;

    ret = mbedtls_snprintf( p, n, "\n" );
    MBEDTLS_X509_SAFE_SNPRINTF;

    return( (int) ( size - n ) );
}